

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_is_destination
              (quicly_conn_t *conn,sockaddr *dest_addr,sockaddr *src_addr,
              quicly_decoded_packet_t *decoded)

{
  ptls_iovec_t vec;
  int iVar1;
  quicly_decoded_packet_t *in_RCX;
  size_t in_RDX;
  quicly_conn_t *in_RDI;
  sockaddr *unaff_retaddr;
  quicly_cid_t *odcid;
  quicly_cid_t *local_38;
  
  if ((*(in_RCX->octets).base & 0x80) != 0) {
    iVar1 = compare_socket_address((sockaddr *)odcid,unaff_retaddr);
    if (iVar1 != 0) {
      return 0;
    }
    if (((in_RDI->super).local.address.sa.sa_family != 0) &&
       (iVar1 = compare_socket_address((sockaddr *)odcid,unaff_retaddr), iVar1 != 0)) {
      return 0;
    }
    iVar1 = quicly_is_client(in_RDI);
    if ((iVar1 == 0) && (((in_RCX->cid).dest.field_0x20 & 1) != 0)) {
      iVar1 = is_retry(in_RDI);
      if (iVar1 == 0) {
        local_38 = &(in_RDI->super).original_dcid;
      }
      else {
        local_38 = &in_RDI->retry_scid;
      }
      vec.len = in_RDX;
      vec.base = (uint8_t *)in_RCX;
      iVar1 = quicly_cid_is_equal(local_38,vec);
      if (iVar1 != 0) goto LAB_0013aea7;
    }
  }
  if (((in_RDI->super).ctx)->cid_encryptor == (quicly_cid_encryptor_t *)0x0) {
    iVar1 = compare_socket_address((sockaddr *)odcid,unaff_retaddr);
    if (iVar1 != 0) {
      if ((in_RDI->super).local.address.sa.sa_family == 0) {
        return 0;
      }
      iVar1 = compare_socket_address((sockaddr *)odcid,unaff_retaddr);
      if (iVar1 == 0) {
        return 0;
      }
      return 0;
    }
  }
  else if ((((in_RDI->super).local.cid_set.plaintext.master_id !=
             (in_RCX->cid).dest.plaintext.master_id) ||
           (*(uint *)&(in_RDI->super).local.cid_set.plaintext.field_0x4 >> 8 !=
            *(uint *)&(in_RCX->cid).dest.plaintext.field_0x4 >> 8)) ||
          ((in_RDI->super).local.cid_set.plaintext.node_id != (in_RCX->cid).dest.plaintext.node_id))
  {
    iVar1 = is_stateless_reset(in_RDI,in_RCX);
    if (iVar1 == 0) {
      return 0;
    }
    in_RCX->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET;
    return 1;
  }
LAB_0013aea7:
  in_RCX->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET;
  return 1;
}

Assistant:

int quicly_is_destination(quicly_conn_t *conn, struct sockaddr *dest_addr, struct sockaddr *src_addr,
                          quicly_decoded_packet_t *decoded)
{
    if (QUICLY_PACKET_IS_LONG_HEADER(decoded->octets.base[0])) {
        /* long header: validate address, then consult the CID */
        if (compare_socket_address(&conn->super.remote.address.sa, src_addr) != 0)
            return 0;
        if (conn->super.local.address.sa.sa_family != AF_UNSPEC &&
            compare_socket_address(&conn->super.local.address.sa, dest_addr) != 0)
            return 0;
        /* server may see the CID generated by the client for Initial and 0-RTT packets */
        if (!quicly_is_client(conn) && decoded->cid.dest.might_be_client_generated) {
            const quicly_cid_t *odcid = is_retry(conn) ? &conn->retry_scid : &conn->super.original_dcid;
            if (quicly_cid_is_equal(odcid, decoded->cid.dest.encrypted))
                goto Found;
        }
    }

    if (conn->super.ctx->cid_encryptor != NULL) {
        /* Note on multiple CIDs
         * Multiple CIDs issued by this host are always based on the same 3-tuple (master_id, thread_id, node_id)
         * and the only difference is path_id. Therefore comparing the 3-tuple is enough to cover all CIDs issued by
         * this host.
         */
        if (conn->super.local.cid_set.plaintext.master_id == decoded->cid.dest.plaintext.master_id &&
            conn->super.local.cid_set.plaintext.thread_id == decoded->cid.dest.plaintext.thread_id &&
            conn->super.local.cid_set.plaintext.node_id == decoded->cid.dest.plaintext.node_id)
            goto Found;
        if (is_stateless_reset(conn, decoded))
            goto Found_StatelessReset;
    } else {
        if (compare_socket_address(&conn->super.remote.address.sa, src_addr) == 0)
            goto Found;
        if (conn->super.local.address.sa.sa_family != AF_UNSPEC &&
            compare_socket_address(&conn->super.local.address.sa, dest_addr) != 0)
            return 0;
    }

    /* not found */
    return 0;

Found:
    decoded->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET;
    return 1;

Found_StatelessReset:
    decoded->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET;
    return 1;
}